

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O1

void __thiscall json11::JsonString::~JsonString(JsonString *this)

{
  pointer pcVar1;
  
  (this->
  super_Value<(json11::Json::Type)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_JsonValue._vptr_JsonValue = (_func_int **)&PTR_type_001b0c70;
  pcVar1 = (this->
           super_Value<(json11::Json::Type)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).m_value._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 !=
      &(this->
       super_Value<(json11::Json::Type)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ).m_value.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

const string &string_value() const override { return m_value; }